

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

bool __thiscall CScript::IsPayToWitnessScriptHash(CScript *this)

{
  char *pcVar1;
  long in_FS_OFFSET;
  bool bVar2;
  
  if (((this->super_CScriptBase)._size == 0x3f) &&
     (pcVar1 = (this->super_CScriptBase)._union.indirect_contents.indirect, *pcVar1 == '\0')) {
    bVar2 = pcVar1[1] == ' ';
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::IsPayToWitnessScriptHash() const
{
    // Extra-fast test for pay-to-witness-script-hash CScripts:
    return (this->size() == 34 &&
            (*this)[0] == OP_0 &&
            (*this)[1] == 0x20);
}